

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

ostream * pstore::file::operator<<(ostream *os,file_handle *fh)

{
  pointer pcVar1;
  ostream *poVar2;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"{ file:\"",8);
  pcVar1 = (fh->path_)._M_dataplus._M_p;
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + (fh->path_)._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_38,local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" }",3);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return poVar2;
}

Assistant:

std::ostream & operator<< (std::ostream & os, file_handle const & fh) {
            return os << R"({ file:")" << fh.path () << R"(" })";
        }